

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

StringRef __thiscall mp::NameProvider::name(NameProvider *this,size_t index,size_t i2)

{
  value_type pcVar1;
  BasicWriter<char> *this_00;
  BasicWriter<char> *pBVar2;
  reference ppcVar3;
  char *pcVar4;
  size_t size;
  ulong in_RDX;
  ulong in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  char *pos1past;
  char *name;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  BasicWriter<char> *in_stack_ffffffffffffff80;
  unsigned_long in_stack_ffffffffffffff88;
  pointer *value;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  BasicStringRef<char> in_stack_ffffffffffffffa8;
  char *local_38;
  StringRef local_10;
  
  this_00 = (BasicWriter<char> *)(in_RSI + 1);
  pBVar2 = (BasicWriter<char> *)
           std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
  if (this_00 < pBVar2) {
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,in_RSI);
    pcVar4 = *ppcVar3;
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (in_RDI,in_RSI + 1);
    pcVar1 = *ppcVar3;
    local_38 = pcVar1 + -1;
    if ((pcVar4 < local_38) && (pcVar1[-2] == '\r')) {
      local_38 = pcVar1 + -2;
    }
    fmt::BasicStringRef<char>::BasicStringRef(&local_10,pcVar4,(long)local_38 - (long)pcVar4);
  }
  else {
    fmt::BasicWriter<char>::clear((BasicWriter<char> *)0x75f505);
    if (in_RSI < in_RDX) {
      value = &in_RDI[4].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      fmt::BasicWriter<char>::operator<<(this_00,in_stack_ffffffffffffffa8);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,(unsigned_long)value);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    }
    else {
      pBVar2 = (BasicWriter<char> *)
               &in_RDI[4].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      fmt::BasicWriter<char>::operator<<(this_00,in_stack_ffffffffffffffa8);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      fmt::BasicWriter<char>::operator<<(pBVar2,in_stack_ffffffffffffff88);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    }
    pcVar4 = fmt::BasicWriter<char>::c_str(in_stack_ffffffffffffff80);
    size = fmt::BasicWriter<char>::size((BasicWriter<char> *)0x75f5f5);
    fmt::BasicStringRef<char>::BasicStringRef(&local_10,pcVar4,size);
  }
  return local_10;
}

Assistant:

fmt::StringRef mp::NameProvider::name(
    std::size_t index, std::size_t i2) {
  if (index + 1 < names_.size()) {
    const char *name = names_[index];
    const auto* pos1past = names_[index + 1] - 1;
    assert( ('\n' == *pos1past) || ('\r' == *pos1past));
    if (pos1past>name && '\r' == *(pos1past-1))            // Windows
      --pos1past;
    return fmt::StringRef(name, pos1past - name);
  }
  writer_.clear();
  if (index>=i2)
    writer_ << gen_name_2_ << '[' << (index - i2 + 1) << ']';
  else
    writer_ << gen_name_ << '[' << (index + 1) << ']';
  return fmt::StringRef(writer_.c_str(), writer_.size());
}